

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O0

void __thiscall
QEGLPlatformContext::adopt
          (QEGLPlatformContext *this,EGLContext context,EGLDisplay display,
          QPlatformOpenGLContext *share)

{
  int iVar1;
  EGLConfig in_RCX;
  char *in_RDX;
  char *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  EGLConfig cfg;
  EGLint n;
  EGLint value;
  EGLint attribs [3];
  char *in_stack_ffffffffffffff48;
  undefined8 uVar2;
  QSurfaceFormat *in_stack_ffffffffffffff50;
  QSurfaceFormat *in_stack_ffffffffffffff58;
  char local_78 [32];
  QEGLPlatformContext *in_stack_ffffffffffffffa8;
  char *local_28;
  int local_1c;
  int local_18;
  undefined4 local_14;
  int iStack_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI[1].context.file = in_RDX;
  local_18 = 0;
  eglQueryContext(in_RDI[1].context.file,in_RSI,0x3028,&local_18);
  local_1c = 0;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  _local_14 = CONCAT44(local_18,0x3028);
  local_c = 0x3038;
  iVar1 = eglChooseConfig(in_RDI[1].context.file,&local_14,&local_28,1,&local_1c);
  if ((iVar1 == 0) || (local_1c != 1)) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)in_stack_ffffffffffffff58,
               (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_stack_ffffffffffffff48);
    QMessageLogger::warning
              (&stack0xffffffffffffffa8,
               "QEGLPlatformContext: Failed to get framebuffer configuration for context");
  }
  else {
    in_RDI[1].context.function = local_28;
    in_stack_ffffffffffffff50 = (QSurfaceFormat *)in_RDI[1].context.file;
    in_stack_ffffffffffffff58 = (QSurfaceFormat *)in_RDI[1].context.function;
    QSurfaceFormat::QSurfaceFormat(in_stack_ffffffffffffff50);
    q_glFormatFromConfig(in_RDX,in_RCX,(QSurfaceFormat *)in_RDI);
    QSurfaceFormat::operator=((QSurfaceFormat *)in_RDI,in_stack_ffffffffffffff58);
    QSurfaceFormat::~QSurfaceFormat(in_stack_ffffffffffffff50);
    QSurfaceFormat::~QSurfaceFormat(in_stack_ffffffffffffff50);
  }
  local_18 = 0;
  eglQueryContext(in_RDI[1].context.file,in_RSI,0x3097,&local_18);
  if ((local_18 == 0x30a2) || (local_18 == 0x30a0)) {
    if (local_18 == 0x30a0) {
      QSurfaceFormat::setRenderableType
                (in_stack_ffffffffffffff50,
                 (RenderableType)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    }
    in_RDI[2].context.version = local_18;
    eglBindAPI(in_RDI[2].context.version);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)in_stack_ffffffffffffff58,
               (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_stack_ffffffffffffff48);
    QMessageLogger::warning(local_78,"QEGLPlatformContext: Failed to get client API type");
    in_RDI[2].context.version = 0x30a0;
  }
  (in_RDI->context).category = in_RSI;
  if (in_RCX == (EGLConfig)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(undefined8 *)((long)in_RCX + 0x18);
  }
  in_RDI[1].context.version = (int)uVar2;
  in_RDI[1].context.line = (int)((ulong)uVar2 >> 0x20);
  updateFormatFromGL(in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEGLPlatformContext::adopt(EGLContext context, EGLDisplay display, QPlatformOpenGLContext *share)
{
    Q_ASSERT(!m_ownsContext);

    m_eglDisplay = display;

    // Figure out the EGLConfig.
    EGLint value = 0;
    eglQueryContext(m_eglDisplay, context, EGL_CONFIG_ID, &value);
    EGLint n = 0;
    EGLConfig cfg;
    const EGLint attribs[] = { EGL_CONFIG_ID, value, EGL_NONE };
    if (eglChooseConfig(m_eglDisplay, attribs, &cfg, 1, &n) && n == 1) {
        m_eglConfig = cfg;
        m_format = q_glFormatFromConfig(m_eglDisplay, m_eglConfig);
    } else {
        qWarning("QEGLPlatformContext: Failed to get framebuffer configuration for context");
    }

    // Fetch client API type.
    value = 0;
    eglQueryContext(m_eglDisplay, context, EGL_CONTEXT_CLIENT_TYPE, &value);
    if (value == EGL_OPENGL_API || value == EGL_OPENGL_ES_API) {
        // if EGL config supports both OpenGL and OpenGL ES render type,
        // q_glFormatFromConfig() with the default "referenceFormat" parameter
        // will always figure it out as OpenGL render type.
        // We can override it to match user's real render type.
        if (value == EGL_OPENGL_ES_API)
            m_format.setRenderableType(QSurfaceFormat::OpenGLES);
        m_api = value;
        eglBindAPI(m_api);
    } else {
        qWarning("QEGLPlatformContext: Failed to get client API type");
        m_api = EGL_OPENGL_ES_API;
    }

    m_eglContext = context;
    m_shareContext = share ? static_cast<QEGLPlatformContext *>(share)->m_eglContext : nullptr;
    updateFormatFromGL();
}